

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatred.cpp
# Opt level: O3

void __thiscall
TPZMatRed<double,_TPZFMatrix<double>_>::U1
          (TPZMatRed<double,_TPZFMatrix<double>_> *this,TPZFMatrix<double> *F)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  ulong uVar4;
  TPZFNMatrix<1000,_double> K1Red;
  TPZFMatrix<double> local_3fe0;
  double local_3f50 [1001];
  TPZFMatrix<double> local_2008;
  double local_1f78 [1001];
  
  lVar1 = this->fDim1;
  local_3fe0.fElem = local_3f50;
  local_3fe0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3fe0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3fe0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0185cc10;
  local_3fe0.fSize = 1000;
  local_3fe0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar1;
  local_3fe0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar1;
  local_3fe0.fGiven = local_3fe0.fElem;
  TPZVec<int>::TPZVec(&local_3fe0.fPivot.super_TPZVec<int>,0);
  local_3fe0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_3fe0.fPivot.super_TPZVec<int>.fStore = local_3fe0.fPivot.fExtAlloc;
  local_3fe0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3fe0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3fe0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_3fe0.fWork.fStore = (double *)0x0;
  local_3fe0.fWork.fNElements = 0;
  local_3fe0.fWork.fNAlloc = 0;
  pdVar3 = (double *)0x0;
  if ((lVar1 != 0) && (uVar4 = lVar1 * lVar1, pdVar3 = local_3fe0.fElem, 1000 < uVar4)) {
    pdVar3 = (double *)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 * 8);
  }
  local_3fe0.fElem = pdVar3;
  local_3fe0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0185c920;
  lVar1 = (this->fF1).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol;
  lVar2 = this->fDim1;
  local_2008.fElem = local_1f78;
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0185cc10;
  local_2008.fSize = 1000;
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar2;
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar1;
  local_2008.fGiven = local_2008.fElem;
  TPZVec<int>::TPZVec(&local_2008.fPivot.super_TPZVec<int>,0);
  local_2008.fPivot.super_TPZVec<int>.fStore = local_2008.fPivot.fExtAlloc;
  local_2008.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_2008.fPivot.super_TPZVec<int>.fNElements = 0;
  local_2008.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_2008.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_2008.fWork.fStore = (double *)0x0;
  local_2008.fWork.fNElements = 0;
  local_2008.fWork.fNAlloc = 0;
  uVar4 = lVar1 * lVar2;
  if (uVar4 == 0) {
    local_2008.fElem = (double *)0x0;
  }
  else if (1000 < (long)uVar4) {
    local_2008.fElem = (double *)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 * 8);
  }
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0185c920;
  K11Reduced(this,&local_3fe0,&local_2008);
  TPZFMatrix<double>::operator=(F,&local_2008);
  TPZMatrix<double>::SolveDirect(&local_3fe0.super_TPZMatrix<double>,F,ELU);
  TPZFMatrix<double>::~TPZFMatrix(&local_2008,&PTR_PTR_0185cbd8);
  TPZFMatrix<double>::~TPZFMatrix(&local_3fe0,&PTR_PTR_0185cbd8);
  return;
}

Assistant:

void TPZMatRed<TVar,TSideMatrix>::U1(TPZFMatrix<TVar> & F)
{
	TPZFNMatrix<1000,TVar> K1Red(fDim1,fDim1), F1Red(fDim1,fF1.Cols());
	K11Reduced(K1Red, F1Red);
	F=(F1Red);
	K1Red.SolveDirect( F ,ELU);
	
	
}